

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O0

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2)

{
  int local_30;
  int local_2c;
  int min;
  int i;
  int *s2_local;
  int *s1_local;
  int n_local;
  HuffmanTree *huffmanTree_local;
  
  for (local_2c = 1; local_2c <= n; local_2c = local_2c + 1) {
    if ((*huffmanTree)[local_2c].parent == 0) {
      local_30 = local_2c;
      break;
    }
  }
  for (local_2c = 1; local_2c <= n; local_2c = local_2c + 1) {
    if (((*huffmanTree)[local_2c].parent == 0) &&
       ((*huffmanTree)[local_2c].weight < (*huffmanTree)[local_30].weight)) {
      local_30 = local_2c;
    }
  }
  *s1 = local_30;
  local_2c = 1;
  do {
    if (n < local_2c) {
LAB_0010129c:
      for (local_2c = 1; local_2c <= n; local_2c = local_2c + 1) {
        if ((((*huffmanTree)[local_2c].parent == 0) && (local_2c != *s1)) &&
           ((*huffmanTree)[local_2c].weight < (*huffmanTree)[local_30].weight)) {
          local_30 = local_2c;
        }
      }
      *s2 = local_30;
      return;
    }
    if (((*huffmanTree)[local_2c].parent == 0) && (local_2c != *s1)) {
      local_30 = local_2c;
      goto LAB_0010129c;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2){
    //标记i
    int i = 0;
    //记录最小权值
    int min;
    //遍历全部节点，找出单节点
    for(i = 1;i <= n;i++){
        //如果此结点的父亲没有，那麽把结点好赋值给min，跳出循环
        if((*huffmanTree)[i].parent == 0){
            min = i;
            break;
        }
    }
    //继续遍历全部节点，找出权值最小节点
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //找到了最小权值的结点，s1指向
    *s1 = min;
    //遍历全部结点
    for(i = 1;i <= n;i++){
        //找出下一个节点，且没有被s1指向，那麽赋值i给min，跳出循环
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            min = i;
            break;
        }
    }
    //继续遍历全部结点，找到权值最小的那一个
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //s2指针指向第二个权值最小的叶子结点
    *s2 = min;
}